

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_SecureChannel_sendBinaryMessage
          (UA_SecureChannel *channel,UA_UInt32 requestId,void *content,UA_DataType *contentType)

{
  undefined1 local_98 [8];
  UA_ChunkInfo ci;
  UA_NodeId typeId;
  size_t messagePos;
  undefined1 auStack_48 [4];
  UA_StatusCode retval;
  UA_ByteString message;
  UA_Connection *connection;
  UA_DataType *contentType_local;
  void *content_local;
  UA_UInt32 requestId_local;
  UA_SecureChannel *channel_local;
  
  message.data = (UA_Byte *)channel->connection;
  if ((UA_Connection *)message.data == (UA_Connection *)0x0) {
    channel_local._4_4_ = 0x80020000;
  }
  else {
    channel_local._4_4_ =
         (*((UA_Connection *)message.data)->getSendBuffer)
                   ((UA_Connection *)message.data,
                    (size_t)(((UA_Connection *)message.data)->localConf).sendBufferSize,
                    (UA_ByteString *)auStack_48);
    if (channel_local._4_4_ == 0) {
      message.length = message.length + 0x18;
      _auStack_48 = _auStack_48 - 0x18;
      typeId.identifier.string.data = (UA_Byte *)0x0;
      ci._32_8_ = *(undefined8 *)&contentType->typeId;
      typeId.identifier.string.length = (size_t)(contentType->typeId).identifier.string.data;
      typeId._2_2_ = 0;
      typeId.namespaceIndex = contentType->binaryEncodingId;
      typeId.identifierType =
           (UA_NodeIdType)((contentType->typeId).identifier.string.length >> 0x20);
      UA_NodeId_encodeBinary
                ((UA_NodeId *)&ci.final,(UA_ByteString *)auStack_48,
                 (size_t *)typeId.identifier.guid.data4);
      ci.requestId._0_2_ = 0;
      ci.chunksSoFar = 0;
      ci._18_6_ = 0;
      ci.messageSizeSoFar._0_1_ = 0;
      ci.channel._4_4_ = 0x47534d;
      ci.messageSizeSoFar._4_4_ = 0;
      if ((typeId._0_4_ == 0x1be) || (typeId._0_4_ == 0x1c1)) {
        ci.channel._4_4_ = 0x4e504f;
      }
      else if ((typeId._0_4_ == 0x1c4) || (typeId._0_4_ == 0x1c7)) {
        ci.channel._4_4_ = 0x4f4c43;
      }
      local_98 = (undefined1  [8])channel;
      ci.channel._0_4_ = requestId;
      channel_local._4_4_ =
           UA_encodeBinary(content,contentType,UA_SecureChannel_sendChunk,local_98,
                           (UA_ByteString *)auStack_48,(size_t *)typeId.identifier.guid.data4);
      if (channel_local._4_4_ == 0) {
        ci.messageSizeSoFar._0_1_ = 1;
        channel_local._4_4_ =
             UA_SecureChannel_sendChunk
                       ((UA_ChunkInfo *)local_98,(UA_ByteString *)auStack_48,
                        (size_t)typeId.identifier.string.data);
      }
      else if (((byte)ci.messageSizeSoFar & 1) == 0) {
        ci.messageSizeSoFar._4_4_ = channel_local._4_4_;
        UA_SecureChannel_sendChunk
                  ((UA_ChunkInfo *)local_98,(UA_ByteString *)auStack_48,
                   (size_t)typeId.identifier.string.data);
      }
    }
  }
  return channel_local._4_4_;
}

Assistant:

UA_StatusCode
UA_SecureChannel_sendBinaryMessage(UA_SecureChannel *channel, UA_UInt32 requestId,
                                   const void *content, const UA_DataType *contentType) {
    UA_Connection *connection = channel->connection;
    if(!connection)
        return UA_STATUSCODE_BADINTERNALERROR;

    /* Allocate the message buffer */
    UA_ByteString message;
    UA_StatusCode retval =
        connection->getSendBuffer(connection, connection->localConf.sendBufferSize, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Hide the message beginning where the header will be encoded */
    message.data = &message.data[UA_SECURE_MESSAGE_HEADER_LENGTH];
    message.length -= UA_SECURE_MESSAGE_HEADER_LENGTH;

    /* Encode the message type */
    size_t messagePos = 0;
    UA_NodeId typeId = contentType->typeId; /* always numeric */
    typeId.identifier.numeric = contentType->binaryEncodingId;
    UA_NodeId_encodeBinary(&typeId, &message, &messagePos);

    /* Encode with the chunking callback */
    UA_ChunkInfo ci;
    ci.channel = channel;
    ci.requestId = requestId;
    ci.chunksSoFar = 0;
    ci.messageSizeSoFar = 0;
    ci.final = false;
    ci.messageType = UA_MESSAGETYPE_MSG;
    ci.errorCode = UA_STATUSCODE_GOOD;
    if(typeId.identifier.numeric == 446 || typeId.identifier.numeric == 449)
        ci.messageType = UA_MESSAGETYPE_OPN;
    else if(typeId.identifier.numeric == 452 || typeId.identifier.numeric == 455)
        ci.messageType = UA_MESSAGETYPE_CLO;
    retval = UA_encodeBinary(content, contentType,
                             (UA_exchangeEncodeBuffer)UA_SecureChannel_sendChunk,
                             &ci, &message, &messagePos);

    /* Encoding failed, release the message */
    if(retval != UA_STATUSCODE_GOOD) {
        if(!ci.final) {
            /* the abort message was not send */
            ci.errorCode = retval;
            UA_SecureChannel_sendChunk(&ci, &message, messagePos);
        }
        return retval;
    }

    /* Encoding finished, send the final chunk */
    ci.final = UA_TRUE;
    return UA_SecureChannel_sendChunk(&ci, &message, messagePos);
}